

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtobj.cpp
# Opt level: O0

int __thiscall
CVmObjTads::getp_get_method(CVmObjTads *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  int iVar1;
  vm_val_t *in_RDX;
  CVmObjTads *in_RDI;
  tadsobj_sc_search_ctx curpos;
  vm_obj_id_t source_obj;
  vm_obj_id_t prop;
  CVmNativeCodeDesc *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa8;
  vm_obj_id_t in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffb4;
  tadsobj_sc_search_ctx *in_stack_ffffffffffffffb8;
  
  if ((getp_get_method(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_get_method(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_get_method::desc,1);
    __cxa_guard_release(&getp_get_method(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    ((vm_val_t *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                     (uint *)in_RDI,in_stack_ffffffffffffff98);
  if (iVar1 == 0) {
    CVmBif::pop_propid_val();
    tadsobj_sc_search_ctx::tadsobj_sc_search_ctx
              ((tadsobj_sc_search_ctx *)
               CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               in_stack_ffffffffffffffac,in_RDI);
    iVar1 = tadsobj_sc_search_ctx::find_prop
                      (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,
                       (vm_val_t *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                       (vm_obj_id_t *)in_RDI);
    if (iVar1 == 0) {
      vm_val_t::set_nil(in_RDX);
    }
    else {
      switch(in_RDX->typ) {
      case VM_DSTRING:
        in_RDX->typ = VM_SSTRING;
        break;
      default:
        vm_val_t::set_nil(in_RDX);
        break;
      case VM_CODEOFS:
        in_RDX->typ = VM_FUNCPTR;
        break;
      case VM_OBJX:
        in_RDX->typ = VM_OBJ;
        break;
      case VM_BIFPTRX:
        in_RDX->typ = VM_BIFPTR;
      }
    }
  }
  return 1;
}

Assistant:

int CVmObjTads::getp_get_method(VMG_ vm_obj_id_t self,
                                vm_val_t *retval, uint *argc)
{
    static CVmNativeCodeDesc desc(1);

    /* check arguments: getMethod(&propid) */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* retrieve the property ID */
    vm_obj_id_t prop = CVmBif::pop_propid_val(vmg0_);

    /* find the property */
    vm_obj_id_t source_obj;
    tadsobj_sc_search_ctx curpos(vmg_ self, this);
    if (curpos.find_prop(vmg_ prop, retval, &source_obj))
    {
        /* the property is definfed - check its type */
        switch (retval->typ)
        {
        case VM_CODEOFS:
            /* it's a direct call to code - convert to a function pointer */
            retval->typ = VM_FUNCPTR;
            break;

        case VM_DSTRING:
            /* it's a self-printing constant string - convert to string */
            retval->typ = VM_SSTRING;
            break;

        case VM_OBJX:
            /* 
             *   It's an executable object, which is either a self-printing
             *   non-constant string or an execute-on-invoke anonymous
             *   function.  In either case, simply convert it back to an
             *   ordinary value. 
             */
            retval->typ = VM_OBJ;
            break;

        case VM_BIFPTRX:
            /* 
             *   executable built-in function pointer - convert back to a
             *   regular bif pointer 
             */
            retval->typ = VM_BIFPTR;
            break;

        default:
            /* other types aren't executable methods, so return nil */
            retval->set_nil();
            break;
        }
    }
    else
    {
        /* this property isn't defined - return nil */
        retval->set_nil();
    }

    /* handled */
    return TRUE;
}